

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O0

int entersweep(lua_State *L)

{
  GCObject **ppGVar1;
  int local_1c;
  global_State *pgStack_18;
  int n;
  global_State *g;
  lua_State *L_local;
  
  pgStack_18 = L->l_G;
  local_1c = 0;
  pgStack_18->gcstate = '\x02';
  pgStack_18->sweepstrgc = 0;
  g = (global_State *)L;
  ppGVar1 = sweeptolive(L,&pgStack_18->finobj,&local_1c);
  pgStack_18->sweepfin = ppGVar1;
  ppGVar1 = sweeptolive((lua_State *)g,&pgStack_18->allgc,&local_1c);
  pgStack_18->sweepgc = ppGVar1;
  return local_1c;
}

Assistant:

static int entersweep (lua_State *L) {
  global_State *g = G(L);
  int n = 0;
  g->gcstate = GCSsweepstring;
  lua_assert(g->sweepgc == NULL && g->sweepfin == NULL);
  /* prepare to sweep strings, finalizable objects, and regular objects */
  g->sweepstrgc = 0;
  g->sweepfin = sweeptolive(L, &g->finobj, &n);
  g->sweepgc = sweeptolive(L, &g->allgc, &n);
  return n;
}